

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectRestraint.cpp
# Opt level: O3

void __thiscall OpenMD::ObjectRestraint::calcForce(ObjectRestraint *this,Vector3d *struc)

{
  Vector3d *pVVar1;
  undefined8 uVar2;
  uint i;
  uint uVar3;
  long lVar4;
  mapped_type *pmVar5;
  double tmp;
  double dVar6;
  double tmp_1;
  double dVar7;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result;
  Vector<double,_3U> result_3;
  Vector<double,_3U> result_1;
  double local_a8 [4];
  double local_88;
  undefined8 uStack_80;
  double local_78 [4];
  double local_58 [4];
  double local_38 [4];
  
  (this->super_Restraint).pot_ = 0.0;
  pVVar1 = &this->force_;
  if (pVVar1 != (Vector3d *)OpenMD::V3Zero) {
    (this->force_).super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
    uVar2 = OpenMD::V3Zero._8_8_;
    (pVVar1->super_Vector<double,_3U>).data_[0] = (double)OpenMD::V3Zero._0_8_;
    (this->force_).super_Vector<double,_3U>.data_[1] = (double)uVar2;
  }
  uVar3 = (this->super_Restraint).restType_;
  if ((uVar3 & 1) != 0) {
    local_78[0] = 0.0;
    local_78[1] = 0.0;
    local_78[2] = 0.0;
    lVar4 = 0;
    do {
      local_78[lVar4] =
           (struc->super_Vector<double,_3U>).data_[lVar4] -
           (this->refPos_).super_Vector<double,_3U>.data_[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    dVar6 = 0.0;
    lVar4 = 0;
    do {
      dVar6 = dVar6 + local_78[lVar4] * local_78[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    dVar7 = (this->super_Restraint).kDisp_;
    local_38[0] = 0.0;
    local_38[1] = 0.0;
    local_38[2] = 0.0;
    lVar4 = 0;
    do {
      local_38[lVar4] = local_78[lVar4] * -dVar7;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_88 = 0.0;
    lVar4 = 0;
    do {
      local_88 = local_88 + local_78[lVar4] * local_78[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_88 = dVar7 * 0.5 * local_88;
    (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + local_88;
    dVar7 = (this->super_Restraint).scaleFactor_;
    local_a8[0] = 0.0;
    local_a8[1] = 0.0;
    local_a8[2] = 0.0;
    lVar4 = 0;
    do {
      local_a8[lVar4] = local_38[lVar4] * dVar7;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar4 = 0;
    do {
      (pVVar1->super_Vector<double,_3U>).data_[lVar4] =
           local_a8[lVar4] + (pVVar1->super_Vector<double,_3U>).data_[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    if ((this->super_Restraint).printRest_ == true) {
      local_a8[0] = (double)CONCAT44(local_a8[0]._4_4_,1);
      uStack_80 = 0;
      pmVar5 = std::
               map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
               ::operator[](&(this->super_Restraint).restInfo_,(key_type *)local_a8);
      pmVar5->first = dVar6;
      pmVar5->second = local_88;
    }
    uVar3 = (this->super_Restraint).restType_;
  }
  if ((uVar3 & 2) != 0) {
    dVar7 = (struc->super_Vector<double,_3U>).data_[2] - (this->super_Restraint).posZ0_;
    dVar6 = (this->super_Restraint).kAbs_;
    local_a8[0] = 0.0;
    local_a8[1] = 0.0;
    local_a8[2] = -dVar6 * dVar7;
    local_88 = dVar6 * 0.5 * dVar7 * dVar7;
    (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + local_88;
    dVar6 = (this->super_Restraint).scaleFactor_;
    local_58[0] = 0.0;
    local_58[1] = 0.0;
    local_58[2] = 0.0;
    lVar4 = 0;
    do {
      local_58[lVar4] = local_a8[lVar4] * dVar6;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar4 = 0;
    do {
      (pVVar1->super_Vector<double,_3U>).data_[lVar4] =
           local_58[lVar4] + (pVVar1->super_Vector<double,_3U>).data_[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    if ((this->super_Restraint).printRest_ == true) {
      local_58[0] = (double)CONCAT44(local_58[0]._4_4_,2);
      uStack_80 = 0;
      pmVar5 = std::
               map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
               ::operator[](&(this->super_Restraint).restInfo_,(key_type *)local_58);
      pmVar5->first = dVar7;
      pmVar5->second = local_88;
    }
  }
  return;
}

Assistant:

void ObjectRestraint::calcForce(Vector3d struc) {
    pot_   = 0.0;
    force_ = V3Zero;

    if (restType_ & rtDisplacement) {
      Vector3d del = struc - refPos_;
      RealType r   = del.length();
      Vector3d frc = -kDisp_ * del;
      RealType p   = 0.5 * kDisp_ * del.lengthSquare();

      pot_ += p;
      force_ += frc * scaleFactor_;
      if (printRest_) restInfo_[rtDisplacement] = std::make_pair(r, p);
    }

    if (restType_ & rtAbsoluteZ) {
      RealType r   = struc(2) - posZ0_;
      Vector3d frc = Vector3d(0.0, 0.0, -kAbs_ * r);
      RealType p   = 0.5 * kAbs_ * r * r;

      pot_ += p;
      force_ += frc * scaleFactor_;
      if (printRest_) restInfo_[rtAbsoluteZ] = std::make_pair(r, p);
    }
  }